

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.hpp
# Opt level: O3

void __thiscall Centaurus::Stream::skip_multiline_comment(Stream *this)

{
  wchar_t *pwVar1;
  wchar_t wVar2;
  StreamException *__return_storage_ptr__;
  
  do {
    while (wVar2 = get(this), wVar2 != L'*') {
      if (wVar2 == L'\0') {
        __return_storage_ptr__ = (StreamException *)__cxa_allocate_exception(0x28);
        unexpected(__return_storage_ptr__,this,L'\xffffffff');
        __cxa_throw(__return_storage_ptr__,&StreamException::typeinfo,
                    StreamException::~StreamException);
      }
    }
    pwVar1 = (this->m_cur)._M_current;
  } while ((pwVar1 == (this->m_str)._M_dataplus._M_p + (this->m_str)._M_string_length) ||
          (*pwVar1 != L'/'));
  get(this);
  return;
}

Assistant:

void skip_multiline_comment()
    {
        wchar_t ch = get();
        for (; ch != L'\0'; ch = get())
        {
            if (ch == L'*')
            {
                ch = peek();
                if (ch == L'/')
                {
                    get();
                    return;
                }
            }
        }
        throw unexpected(EOF);
    }